

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O0

ASTRefCount<antlr::BaseAST> * __thiscall
antlr::ASTRefCount<antlr::BaseAST>::operator=(ASTRefCount<antlr::BaseAST> *this,AST *other)

{
  _func_int **pp_Var1;
  bool bVar2;
  ASTRef *pAVar3;
  AST *in_RDI;
  ASTRef *tmp;
  
  pAVar3 = ASTRef::getRef(in_RDI);
  if ((((ASTRef *)in_RDI->_vptr_AST != (ASTRef *)0x0) &&
      (bVar2 = ASTRef::decrement((ASTRef *)in_RDI->_vptr_AST), bVar2)) &&
     (pp_Var1 = in_RDI->_vptr_AST, pp_Var1 != (_func_int **)0x0)) {
    ASTRef::~ASTRef((ASTRef *)in_RDI);
    operator_delete(pp_Var1,0x10);
  }
  in_RDI->_vptr_AST = (_func_int **)pAVar3;
  return (ASTRefCount<antlr::BaseAST> *)in_RDI;
}

Assistant:

ASTRefCount<T>& operator=(AST* other)
	{
		ASTRef* tmp = ASTRef::getRef(other);

		if (ref && ref->decrement())
			delete ref;

		ref=tmp;

		return *this;
	}